

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s *
fio_str_readfile(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,char *filename,
                intptr_t start_at,intptr_t limit)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  fio_str_info_s local_138;
  fio_str_info_s local_120;
  size_t local_108;
  size_t org_len;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  size_t home_len;
  size_t filename_len;
  char *home;
  size_t path_len;
  char *path;
  undefined1 local_b8 [4];
  int file;
  stat f_data;
  intptr_t limit_local;
  intptr_t start_at_local;
  char *filename_local;
  fio_str_s_conflict *s_local;
  
  f_data.__glibc_reserved[2] = limit;
  memset(__return_storage_ptr__,0,0x18);
  if ((filename != (char *)0x0) && (s != (fio_str_s_conflict *)0x0)) {
    path._4_4_ = -1;
    path_len = 0;
    home = (char *)0x0;
    start_at_local = (intptr_t)filename;
    if ((*filename == '~') &&
       (((filename[1] == '/' || (filename[1] == '\\')) &&
        (filename_len = (size_t)getenv("HOME"), (char *)filename_len != (char *)0x0)))) {
      home_len = strlen(filename);
      local_e8 = strlen((char *)filename_len);
      if (0xffff < local_e8 + home_len) {
        return __return_storage_ptr__;
      }
      if ((*(char *)(filename_len + (local_e8 - 1)) == '/') ||
         (*(char *)(filename_len + (local_e8 - 1)) == '\\')) {
        local_e8 = local_e8 - 1;
      }
      home = (char *)((local_e8 + home_len) - 1);
      path_len = (size_t)fio_malloc(local_e8 + home_len);
      if ((void *)path_len == (void *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4497"
                        );
        }
        kill(0,2);
        piVar2 = __errno_location();
        exit(*piVar2);
      }
      memcpy((void *)path_len,(void *)filename_len,local_e8);
      memcpy((void *)(path_len + local_e8),filename + 1,home_len);
      home[path_len] = '\0';
      start_at_local = path_len;
    }
    iVar1 = stat((char *)start_at_local,(stat *)local_b8);
    if (iVar1 == 0) {
      if (((long)f_data.st_rdev < 1) || ((long)f_data.st_rdev <= start_at)) {
        fio_str_info((fio_str_info_s *)&org_len,s);
        __return_storage_ptr__->capa = org_len;
        __return_storage_ptr__->len = local_f8;
        __return_storage_ptr__->data = local_f0;
      }
      else {
        path._4_4_ = open((char *)start_at_local,0);
        if (path._4_4_ != -1) {
          limit_local = start_at;
          if ((start_at < 0) && (limit_local = f_data.st_rdev + start_at, limit_local < 0)) {
            limit_local = 0;
          }
          if ((f_data.__glibc_reserved[2] < 1) ||
             ((long)f_data.st_rdev < f_data.__glibc_reserved[2] + limit_local)) {
            f_data.__glibc_reserved[2] = f_data.st_rdev - limit_local;
          }
          local_108 = fio_str_len(s);
          fio_str_resize(&local_120,s,local_108 + f_data.__glibc_reserved[2]);
          __return_storage_ptr__->capa = local_120.capa;
          __return_storage_ptr__->len = local_120.len;
          __return_storage_ptr__->data = local_120.data;
          sVar3 = pread(path._4_4_,__return_storage_ptr__->data + local_108,
                        f_data.__glibc_reserved[2],limit_local);
          if (sVar3 != f_data.__glibc_reserved[2]) {
            fio_str_resize(&local_138,s,local_108);
            __return_storage_ptr__->data = (char *)0x0;
            __return_storage_ptr__->capa = 0;
            __return_storage_ptr__->len = 0;
          }
          close(path._4_4_);
        }
      }
    }
    fio_free((void *)path_len);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_FUNC fio_str_info_s fio_str_readfile(fio_str_s *s, const char *filename,
                                         intptr_t start_at, intptr_t limit) {
  fio_str_info_s state = {.data = NULL};
#if defined(__unix__) || defined(__linux__) || defined(__APPLE__) ||           \
    defined(__CYGWIN__)
  /* POSIX implementations. */
  if (filename == NULL || !s)
    return state;
  struct stat f_data;
  int file = -1;
  char *path = NULL;
  size_t path_len = 0;

  if (filename[0] == '~' && (filename[1] == '/' || filename[1] == '\\')) {
    char *home = getenv("HOME");
    if (home) {
      size_t filename_len = strlen(filename);
      size_t home_len = strlen(home);
      if ((home_len + filename_len) >= (1 << 16)) {
        /* too long */
        return state;
      }
      if (home[home_len - 1] == '/' || home[home_len - 1] == '\\')
        --home_len;
      path_len = home_len + filename_len - 1;
      path = FIO_MALLOC(path_len + 1);
      FIO_ASSERT_ALLOC(path);
      memcpy(path, home, home_len);
      memcpy(path + home_len, filename + 1, filename_len);
      path[path_len] = 0;
      filename = path;
    }
  }

  if (stat(filename, &f_data)) {
    goto finish;
  }

  if (f_data.st_size <= 0 || start_at >= f_data.st_size) {
    state = fio_str_info(s);
    goto finish;
  }

  file = open(filename, O_RDONLY);
  if (-1 == file)
    goto finish;

  if (start_at < 0) {
    start_at = f_data.st_size + start_at;
    if (start_at < 0)
      start_at = 0;
  }

  if (limit <= 0 || f_data.st_size < (limit + start_at))
    limit = f_data.st_size - start_at;

  const size_t org_len = fio_str_len(s);
  state = fio_str_resize(s, org_len + limit);
  if (pread(file, state.data + org_len, limit, start_at) != (ssize_t)limit) {
    fio_str_resize(s, org_len);
    state.data = NULL;
    state.len = state.capa = 0;
  }
  close(file);
finish:
  FIO_FREE(path);
  return state;
#else
  /* TODO: consider adding non POSIX implementations. */
  FIO_LOG_ERROR("File reading requires a posix system (ignored!).\n");
  return state;
#endif
}